

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

void __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::InnerMap::Resize(InnerMap *this,size_t new_num_buckets)

{
  Arena *this_00;
  void *pvVar1;
  ulong uVar2;
  void **ppvVar3;
  LogMessage *other;
  void **ppvVar4;
  size_type index;
  LogFinisher local_61;
  LogMessage local_60;
  ulong uVar5;
  
  if (this->num_buckets_ == 1) {
    this->index_of_first_non_null_ = 8;
    this->num_buckets_ = 8;
    this_00 = (this->alloc_).arena_;
    if (this_00 == (Arena *)0x0) {
      ppvVar3 = (void **)operator_new(0x40);
    }
    else {
      ppvVar3 = (void **)Arena::AllocateAlignedWithHook
                                   (this_00,0x40,(type_info *)&unsigned_char::typeinfo);
    }
    ppvVar3[6] = (void *)0x0;
    ppvVar3[7] = (void *)0x0;
    ppvVar3[4] = (void *)0x0;
    ppvVar3[5] = (void *)0x0;
    ppvVar3[2] = (void *)0x0;
    ppvVar3[3] = (void *)0x0;
    *ppvVar3 = (void *)0x0;
    ppvVar3[1] = (void *)0x0;
    this->table_ = ppvVar3;
    uVar2 = rdtsc();
    this->seed_ = (uVar2 & 0xffffffff) + ((ulong)this >> 4) + (uVar2 & 0xffffffff00000000);
  }
  else {
    if (new_num_buckets < 8) {
      internal::LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
                 ,0x3a0);
      other = internal::LogMessage::operator<<
                        (&local_60,"CHECK failed: (new_num_buckets) >= (kMinTableSize): ");
      internal::LogFinisher::operator=(&local_61,other);
      internal::LogMessage::~LogMessage(&local_60);
    }
    uVar2 = this->num_buckets_;
    ppvVar3 = this->table_;
    this->num_buckets_ = new_num_buckets;
    ppvVar4 = CreateEmptyTable(this,new_num_buckets);
    this->table_ = ppvVar4;
    index = this->index_of_first_non_null_;
    this->index_of_first_non_null_ = this->num_buckets_;
    while (index < uVar2) {
      pvVar1 = ppvVar3[index];
      uVar5 = index;
      if (pvVar1 != (void *)0x0) {
        if (pvVar1 == ppvVar3[index ^ 1]) {
          if ((pvVar1 != (void *)0x0) && (pvVar1 == ppvVar3[index ^ 1])) {
            uVar5 = index + 1;
            TransferTree(this,ppvVar3,index);
          }
        }
        else {
          TransferList(this,ppvVar3,index);
        }
      }
      index = uVar5 + 1;
    }
    if ((this->alloc_).arena_ == (Arena *)0x0) {
      operator_delete(ppvVar3,uVar2 << 3);
    }
  }
  return;
}

Assistant:

void Resize(size_t new_num_buckets) {
      if (num_buckets_ == internal::kGlobalEmptyTableSize) {
        // This is the global empty array.
        // Just overwrite with a new one. No need to transfer or free anything.
        num_buckets_ = index_of_first_non_null_ = kMinTableSize;
        table_ = CreateEmptyTable(num_buckets_);
        seed_ = Seed();
        return;
      }

      GOOGLE_DCHECK_GE(new_num_buckets, kMinTableSize);
      void** const old_table = table_;
      const size_type old_table_size = num_buckets_;
      num_buckets_ = new_num_buckets;
      table_ = CreateEmptyTable(num_buckets_);
      const size_type start = index_of_first_non_null_;
      index_of_first_non_null_ = num_buckets_;
      for (size_type i = start; i < old_table_size; i++) {
        if (internal::TableEntryIsNonEmptyList(old_table, i)) {
          TransferList(old_table, i);
        } else if (internal::TableEntryIsTree(old_table, i)) {
          TransferTree(old_table, i++);
        }
      }
      Dealloc<void*>(old_table, old_table_size);
    }